

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

CLabel * __thiscall
IRT::CLabelStatement::Label(CLabel *__return_storage_ptr__,CLabelStatement *this)

{
  CLabelStatement *this_local;
  
  CLabel::CLabel(__return_storage_ptr__,&this->label);
  return __return_storage_ptr__;
}

Assistant:

CLabel CLabelStatement::Label( ) const {
    return label;
}